

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_surjectionproof_allocate_initialized
              (secp256k1_context *ctx,secp256k1_surjectionproof **proof_out_p,size_t *input_index,
              secp256k1_fixed_asset_tag *fixed_input_tags,size_t n_input_tags,
              size_t n_input_tags_to_use,secp256k1_fixed_asset_tag *fixed_output_tag,
              size_t n_max_iterations,uchar *random_seed32)

{
  int iVar1;
  secp256k1_surjectionproof *proof;
  
  if (proof_out_p == (secp256k1_surjectionproof **)0x0) {
    (*(ctx->illegal_callback).fn)("proof_out_p != NULL",(ctx->illegal_callback).data);
    iVar1 = 0;
  }
  else {
    *proof_out_p = (secp256k1_surjectionproof *)0x0;
    proof = (secp256k1_surjectionproof *)checked_malloc(&ctx->error_callback,0x2048);
    iVar1 = 0;
    if (proof != (secp256k1_surjectionproof *)0x0) {
      iVar1 = secp256k1_surjectionproof_initialize
                        (ctx,proof,input_index,fixed_input_tags,n_input_tags,n_input_tags_to_use,
                         fixed_output_tag,n_max_iterations,random_seed32);
      if (iVar1 == 0) {
        free(proof);
        iVar1 = 0;
      }
      else {
        *proof_out_p = proof;
      }
    }
  }
  return iVar1;
}

Assistant:

int secp256k1_surjectionproof_allocate_initialized(const secp256k1_context* ctx, secp256k1_surjectionproof** proof_out_p, size_t *input_index, const secp256k1_fixed_asset_tag* fixed_input_tags, const size_t n_input_tags, const size_t n_input_tags_to_use, const secp256k1_fixed_asset_tag* fixed_output_tag, const size_t n_max_iterations, const unsigned char *random_seed32) {
    int ret = 0;
    secp256k1_surjectionproof* proof;

    VERIFY_CHECK(ctx != NULL);

    ARG_CHECK(proof_out_p != NULL);
    *proof_out_p = 0;

    proof = (secp256k1_surjectionproof*)checked_malloc(&ctx->error_callback, sizeof(secp256k1_surjectionproof));
    if (proof != NULL) {
        ret = secp256k1_surjectionproof_initialize(ctx, proof, input_index, fixed_input_tags, n_input_tags, n_input_tags_to_use, fixed_output_tag, n_max_iterations, random_seed32);
        if (ret) {
            *proof_out_p = proof;
        }
        else {
            free(proof);
        }
    }
    return ret;
}